

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_set_del_docs_test(void)

{
  fdb_status fVar1;
  size_t metalen;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffff7b8;
  void *in_stack_fffffffffffff7c0;
  fdb_iterator *in_stack_fffffffffffff7c8;
  size_t in_stack_fffffffffffff7e0;
  fdb_doc *in_stack_fffffffffffff810;
  fdb_kvs_handle *in_stack_fffffffffffff818;
  fdb_doc **in_stack_fffffffffffff830;
  fdb_iterator *in_stack_fffffffffffff838;
  fdb_kvs_info *in_stack_fffffffffffff920;
  fdb_kvs_handle *in_stack_fffffffffffff928;
  fdb_kvs_config *in_stack_fffffffffffff960;
  char *in_stack_fffffffffffff968;
  fdb_kvs_handle **in_stack_fffffffffffff970;
  fdb_file_handle *in_stack_fffffffffffff978;
  fdb_config *in_stack_fffffffffffff9d8;
  char *in_stack_fffffffffffff9e0;
  fdb_file_handle **in_stack_fffffffffffff9e8;
  long local_4e8;
  fdb_doc *vdoc;
  fdb_doc **doc;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_kvs_info info;
  fdb_kvs_handle *kv1;
  fdb_iterator *it;
  fdb_file_handle *dbfile;
  char local_378 [4];
  int val2;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  uint local_70;
  int expected_doc_count;
  int n;
  int k;
  int j;
  int i;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  local_70 = 0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  fdb_kvs_open(in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               in_stack_fffffffffffff960);
  expected_doc_count = 0;
  do {
    if (0x13 < expected_doc_count) {
      fdb_kvs_close(in_stack_fffffffffffff7b8);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffff7b8);
      fdb_shutdown();
      memleak_end();
      if (iterator_set_del_docs_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","iterator set del docs");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","iterator set del docs");
      }
      return;
    }
    for (k = 0; k < 100; k = k + 1) {
      sprintf(metabuf + 0xf8,"key%02d%03d",(ulong)(uint)expected_doc_count,(ulong)(uint)k);
      sprintf(bodybuf + 0xf8,"meta%02d%03d",(ulong)(uint)expected_doc_count,(ulong)(uint)k);
      sprintf(local_378,"body%02d%03d",(ulong)(uint)expected_doc_count,(ulong)(uint)k);
      strlen(metabuf + 0xf8);
      strlen(bodybuf + 0xf8);
      meta = (void *)0x1112f5;
      metalen = strlen(local_378);
      fdb_doc_create((fdb_doc **)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                     (size_t)in_stack_fffffffffffff7b8,meta,metalen,(void *)0x11132c,
                     in_stack_fffffffffffff7e0);
      fdb_set((fdb_kvs_handle *)info.file,*(fdb_doc **)(&stack0xfffffffffffff7b8 + (long)k * 8));
      local_70 = local_70 + 1;
    }
    fdb_commit((fdb_file_handle *)in_stack_fffffffffffff7b8,'\0');
    for (n = 0x19; n < 0x32; n = n + 1) {
      fdb_del(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
      local_70 = local_70 - 1;
    }
    fdb_commit((fdb_file_handle *)in_stack_fffffffffffff7b8,'\0');
    fdb_get_kvs_info(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
    if (info.last_seqnum != (long)(int)local_70) {
      fdb_iterator_init((fdb_kvs_handle *)info.file,(fdb_iterator **)&kv1,(void *)0x0,0,(void *)0x0,
                        0,0);
      dbfile._4_4_ = 0;
      do {
        fdb_iterator_get(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        if ((*(byte *)(local_4e8 + 0x48) & 1) == 0) {
          dbfile._4_4_ = dbfile._4_4_ + 1;
        }
        fdb_doc_free((fdb_doc *)0x11147f);
        fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffff7b8);
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      fdb_iterator_close(in_stack_fffffffffffff7c8);
      printf("dbdocs(%d) expected(%d)\n",(ulong)dbfile._4_4_,(ulong)local_70);
    }
    if (info.last_seqnum != (long)(int)local_70) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x72b);
      iterator_set_del_docs_test::__test_pass = 0;
      if (info.last_seqnum != (long)(int)local_70) {
        __assert_fail("info.doc_count == (size_t)expected_doc_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x72b,"void iterator_set_del_docs_test()");
      }
    }
    for (k = 0; k < 100; k = k + 1) {
      fdb_doc_free((fdb_doc *)0x111547);
    }
    expected_doc_count = expected_doc_count + 1;
  } while( true );
}

Assistant:

void iterator_set_del_docs_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    int i, j, k, n=100;
    int expected_doc_count=0;
    char keybuf[256], metabuf[256], bodybuf[256];
    int val2;
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *vdoc;
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 10;
    fconfig.purging_interval = 1; //retain deletes until compaction

    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);

    for(k=0;k<20;++k){
        // set n docs
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%02d%03d", k, i);
            sprintf(metabuf, "meta%02d%03d", k, i);
            sprintf(bodybuf, "body%02d%03d", k, i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            fdb_set(kv1, doc[i]);
            expected_doc_count++;
        }

        // commit
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        // delete subset of recently loaded docs
        for(j=n/4;j<n/2;j++){
            fdb_del(kv1, doc[j]);
            expected_doc_count--;
        }
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        fdb_get_kvs_info(kv1, &info);
        if(info.doc_count != (size_t)expected_doc_count){
            // test already failed further debugging check info
            fdb_iterator_init(kv1, &it, NULL, 0,
                              NULL, 0, FDB_ITR_NONE);
            val2=0;
            do {
                fdb_iterator_get(it, &vdoc);
                if (!vdoc->deleted){
                    val2++;
                }
                fdb_doc_free(vdoc);
            } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
            fdb_iterator_close(it);
            printf("dbdocs(%d) expected(%d)\n", val2, expected_doc_count);
        }
        TEST_CHK(info.doc_count == (size_t)expected_doc_count);

        // preliminary cleanup
        for(i=0;i<n;++i){
            fdb_doc_free(doc[i]);
        }
    }

    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("iterator set del docs");
}